

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void kratos::copy_attrs(Var *src,Var *target)

{
  pointer psVar1;
  shared_ptr<kratos::Attribute> *attr;
  pointer __args;
  
  __args = (src->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (src->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__args != psVar1) {
    do {
      std::
      vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
      ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
                ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
                  *)&(target->super_IRNode).attributes_,__args);
      __args = __args + 1;
    } while (__args != psVar1);
  }
  return;
}

Assistant:

void copy_attrs(const Var& src, Var& target) {
    auto const& attributes = src.get_attributes();
    for (auto const& attr : attributes) {
        target.add_attribute(attr);
    }
}